

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<7,_0,_13,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  undefined8 *puVar1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  Vector<float,_3> res_3;
  Vector<float,_3> res_4;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  float afStack_198 [6];
  float local_180 [6];
  Vec4 *local_168;
  ulong local_160;
  undefined4 local_158;
  float local_150 [4];
  float local_140 [4];
  float local_130 [6];
  Matrix<float,_4,_4> local_118;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Vec4 *local_98;
  float local_90;
  float local_84 [2];
  float local_7c;
  float local_78;
  float local_70 [3];
  float local_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  puVar1 = &local_58;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  puVar2 = &s_constInMat4;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  increment<float,4,4>
            ((Matrix<float,_4,_4> *)&local_98,(MatrixCaseUtils *)&local_58,
             (Matrix<float,_4,_4> *)&DAT_00000004);
  local_168 = local_98;
  local_160 = CONCAT44(local_160._4_4_,local_90);
  afStack_198[2] = local_84[0];
  afStack_198[3] = local_84[1];
  afStack_198[4] = local_7c;
  local_d8 = 0;
  uStack_d0 = (ulong)uStack_d0._4_4_ << 0x20;
  lVar3 = 0;
  do {
    *(float *)((long)&local_d8 + lVar3 * 4) =
         *(float *)((long)&local_168 + lVar3 * 4) + afStack_198[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_180[3] = local_70[0];
  local_180[4] = local_70[1];
  local_180[5] = local_78;
  local_118.m_data.m_data[0].m_data[0] = 0.0;
  local_118.m_data.m_data[0].m_data[1] = 0.0;
  local_118.m_data.m_data[0].m_data[2] = 0.0;
  lVar3 = 0;
  do {
    local_118.m_data.m_data[0].m_data[lVar3] =
         *(float *)((long)&local_d8 + lVar3 * 4) + local_180[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_180[2] = local_64;
  local_140[0] = 0.0;
  local_140[1] = 0.0;
  local_140[2] = 0.0;
  lVar3 = 0;
  do {
    local_140[lVar3] = local_118.m_data.m_data[0].m_data[lVar3] + local_180[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  puVar1 = &local_d8;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  puVar2 = &s_constInMat4;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  increment<float,4,4>(&local_118,(MatrixCaseUtils *)&local_d8,(Matrix<float,_4,_4> *)&DAT_00000004)
  ;
  local_180[3] = local_118.m_data.m_data[0].m_data[0];
  local_180[4] = local_118.m_data.m_data[0].m_data[1];
  local_180[5] = local_118.m_data.m_data[0].m_data[2];
  local_180[0] = local_118.m_data.m_data[1].m_data[1];
  local_180[1] = local_118.m_data.m_data[1].m_data[2];
  local_180[2] = local_118.m_data.m_data[1].m_data[3];
  afStack_198[2] = 0.0;
  afStack_198[3] = 0.0;
  afStack_198[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_198[lVar3 + 2] = local_180[lVar3 + 3] + local_180[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_130[3] = local_118.m_data.m_data[2].m_data[2];
  local_130[4] = local_118.m_data.m_data[2].m_data[3];
  local_130[5] = local_118.m_data.m_data[2].m_data[0];
  local_168 = (Vec4 *)0x0;
  local_160 = local_160 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    *(float *)((long)&local_168 + lVar3 * 4) = afStack_198[lVar3 + 2] + local_130[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_130[0] = local_118.m_data.m_data[3].m_data[3];
  local_130[1] = local_118.m_data.m_data[3].m_data[0];
  local_130[2] = local_118.m_data.m_data[3].m_data[1];
  local_150[0] = 0.0;
  local_150[1] = 0.0;
  local_150[2] = 0.0;
  lVar3 = 0;
  do {
    local_150[lVar3] = *(float *)((long)&local_168 + lVar3 * 4) + local_130[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_198[2] = 0.0;
  afStack_198[3] = 0.0;
  afStack_198[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_198[lVar3 + 2] = local_140[lVar3] + local_150[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_168 = &evalCtx->color;
  local_160 = 0x100000000;
  local_158 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_168 + lVar3 * 4)] = afStack_198[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}